

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void llvm::cl::tokenizeConfigFile
               (StringRef Source,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
               bool MarkEOLs)

{
  undefined8 uVar1;
  bool bVar2;
  iterator pcVar3;
  char *pcVar4;
  undefined1 in_R9B;
  StringRef SVar5;
  bool local_f9;
  cl *local_f0;
  char *local_e8;
  char *End;
  char *Start;
  undefined1 local_c8 [8];
  SmallString<128U> Line;
  char *Cur;
  bool MarkEOLs_local;
  SmallVectorImpl<const_char_*> *NewArgv_local;
  StringSaver *Saver_local;
  StringRef Source_local;
  
  Source_local.Data = (char *)Source.Length;
  Saver_local = (StringSaver *)Source.Data;
  Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ =
       StringRef::begin((StringRef *)&Saver_local);
  do {
    uVar1 = Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
            _120_8_;
    pcVar3 = StringRef::end((StringRef *)&Saver_local);
    if ((iterator)uVar1 == pcVar3) {
      return;
    }
    SmallString<128U>::SmallString((SmallString<128U> *)local_c8);
    bVar2 = isWhitespace(*(char *)Line.super_SmallVector<char,_128U>.
                                  super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
    if (bVar2) {
      while( true ) {
        uVar1 = Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
                _120_8_;
        pcVar3 = StringRef::end((StringRef *)&Saver_local);
        local_f9 = false;
        if ((iterator)uVar1 != pcVar3) {
          local_f9 = isWhitespace(*(char *)Line.super_SmallVector<char,_128U>.
                                           super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
        }
        if (local_f9 == false) break;
        Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ =
             Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
             _120_8_ + 1;
      }
    }
    else if (*(char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                      InlineElts._120_8_ == '#') {
      while( true ) {
        uVar1 = Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
                _120_8_;
        pcVar3 = StringRef::end((StringRef *)&Saver_local);
        bVar2 = false;
        if ((iterator)uVar1 != pcVar3) {
          bVar2 = *(char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                           InlineElts._120_8_ != '\n';
        }
        if (!bVar2) break;
        Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ =
             Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
             _120_8_ + 1;
      }
    }
    else {
      End = (char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                    InlineElts._120_8_;
      pcVar3 = StringRef::end((StringRef *)&Saver_local);
      for (; uVar1 = Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                     InlineElts._120_8_,
          (iterator)
          Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_
          != pcVar3;
          Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_
               = Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
                 _120_8_ + 1) {
        pcVar4 = (char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                         InlineElts._120_8_;
        if (*(char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                     InlineElts._120_8_ == '\\') {
          if (((iterator)
               (Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
                _120_8_ + 1) != pcVar3) &&
             ((pcVar4 = (char *)(Line.super_SmallVector<char,_128U>.
                                 super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ + 1),
              *pcVar4 == '\n' ||
              (((*pcVar4 == '\r' &&
                ((iterator)
                 (Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts
                  ._120_8_ + 2) != pcVar3)) &&
               (*(char *)(Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                          InlineElts._120_8_ + 2) == '\n')))))) {
            Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
            _120_8_ = pcVar4;
            SmallString<128u>::append<char_const*>((SmallString<128u> *)local_c8,End,(char *)uVar1);
            if (*(char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                         InlineElts._120_8_ == '\r') {
              Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
              _120_8_ = Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                        InlineElts._120_8_ + 1;
            }
            End = (char *)(Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                           InlineElts._120_8_ + 1);
            pcVar4 = (char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>
                             .InlineElts._120_8_;
          }
        }
        else if (*(char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                          InlineElts._120_8_ == '\n') break;
        Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ =
             pcVar4;
      }
      SmallString<128u>::append<char_const*>
                ((SmallString<128u> *)local_c8,End,
                 (char *)Line.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                         InlineElts._120_8_);
      SVar5 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_c8);
      local_f0 = (cl *)SVar5.Data;
      local_e8 = (char *)SVar5.Length;
      SVar5.Length = (size_t)Saver;
      SVar5.Data = local_e8;
      TokenizeGNUCommandLine
                (local_f0,SVar5,(StringSaver *)NewArgv,
                 (SmallVectorImpl<const_char_*> *)(ulong)MarkEOLs,(bool)in_R9B);
    }
    SmallString<128U>::~SmallString((SmallString<128U> *)local_c8);
  } while( true );
}

Assistant:

void cl::tokenizeConfigFile(StringRef Source, StringSaver &Saver,
                            SmallVectorImpl<const char *> &NewArgv,
                            bool MarkEOLs) {
  for (const char *Cur = Source.begin(); Cur != Source.end();) {
    SmallString<128> Line;
    // Check for comment line.
    if (isWhitespace(*Cur)) {
      while (Cur != Source.end() && isWhitespace(*Cur))
        ++Cur;
      continue;
    }
    if (*Cur == '#') {
      while (Cur != Source.end() && *Cur != '\n')
        ++Cur;
      continue;
    }
    // Find end of the current line.
    const char *Start = Cur;
    for (const char *End = Source.end(); Cur != End; ++Cur) {
      if (*Cur == '\\') {
        if (Cur + 1 != End) {
          ++Cur;
          if (*Cur == '\n' ||
              (*Cur == '\r' && (Cur + 1 != End) && Cur[1] == '\n')) {
            Line.append(Start, Cur - 1);
            if (*Cur == '\r')
              ++Cur;
            Start = Cur + 1;
          }
        }
      } else if (*Cur == '\n')
        break;
    }
    // Tokenize line.
    Line.append(Start, Cur);
    cl::TokenizeGNUCommandLine(Line, Saver, NewArgv, MarkEOLs);
  }
}